

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementTetraCorot_10.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElementTetraCorot_10::ComputeKRMmatricesGlobal(ChElementTetraCorot_10 *this)

{
  ChMatrixRef *in_RSI;
  double in_XMM0_Qa;
  double in_XMM1_Qa;
  double in_XMM2_Qa;
  
  ComputeKRMmatricesGlobal
            ((ChElementTetraCorot_10 *)&this[-1].field_0x1b8,in_RSI,in_XMM0_Qa,in_XMM1_Qa,in_XMM2_Qa
            );
  return;
}

Assistant:

void ChElementTetraCorot_10::ComputeKRMmatricesGlobal(ChMatrixRef H, double Kfactor, double Rfactor, double Mfactor) {
    assert((H.rows() == GetNdofs()) && (H.cols() == GetNdofs()));

    // warp the local stiffness matrix K in order to obtain global tangent stiffness CKCt:
    ChMatrixDynamic<> CK(GetNdofs(), GetNdofs());
    ChMatrixDynamic<> CKCt(GetNdofs(), GetNdofs());  // the global, corotated, K matrix
    ChMatrixCorotation::ComputeCK(StiffnessMatrix, this->A, 10, CK);
    ChMatrixCorotation::ComputeKCt(CK, this->A, 10, CKCt);

    // For K stiffness matrix and R damping matrix:
    double mkfactor = Kfactor + Rfactor * this->GetMaterial()->Get_RayleighDampingK();
    H.block(0, 0, GetNdofs(), GetNdofs()) = mkfactor * CKCt;

    // For M mass matrix:
    if (Mfactor) {
        double lumped_node_mass = (this->GetVolume() * this->Material->Get_density()) / (double)this->GetNnodes();
        for (int id = 0; id < GetNdofs(); id++) {
            double amfactor = Mfactor + Rfactor * this->GetMaterial()->Get_RayleighDampingM();
            H(id, id) += amfactor * lumped_node_mass;
        }
    }
    //***TO DO*** better per-node lumping, or 30x30 consistent mass matrix.
}